

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

xmlListPtr xmlGetRefs(xmlDocPtr doc,xmlChar *ID)

{
  xmlListPtr pxVar1;
  
  if ((ID != (xmlChar *)0x0 && doc != (xmlDocPtr)0x0) &&
     ((xmlHashTablePtr)doc->refs != (xmlHashTablePtr)0x0)) {
    pxVar1 = (xmlListPtr)xmlHashLookup3((xmlHashTablePtr)doc->refs,ID,(xmlChar *)0x0,(xmlChar *)0x0)
    ;
    return pxVar1;
  }
  return (xmlListPtr)0x0;
}

Assistant:

xmlListPtr
xmlGetRefs(xmlDocPtr doc, const xmlChar *ID) {
    xmlRefTablePtr table;

    if (doc == NULL) {
        return(NULL);
    }

    if (ID == NULL) {
        return(NULL);
    }

    table = (xmlRefTablePtr) doc->refs;
    if (table == NULL)
        return(NULL);

    return (xmlHashLookup(table, ID));
}